

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O0

ssize_t __thiscall
jaegertracing::thrift::AggregationValidator_validateTrace_args::read
          (AggregationValidator_validateTrace_args *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  TProtocolException *this_00;
  undefined4 in_register_00000034;
  bool isset_traceId;
  short local_4e;
  TType local_4c;
  undefined1 local_48 [2];
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  TProtocol *iprot_local;
  AggregationValidator_validateTrace_args *this_local;
  
  tracker.prot_ = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)&stack0xffffffffffffffe0,tracker.prot_);
  fname.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_48);
  uVar2 = apache::thrift::protocol::TProtocol::readStructBegin(tracker.prot_,(string *)local_48);
  fname.field_2._12_4_ = uVar2 + fname.field_2._12_4_;
  bVar1 = false;
  while( true ) {
    uVar2 = apache::thrift::protocol::TProtocol::readFieldBegin
                      (tracker.prot_,(string *)local_48,&local_4c,&local_4e);
    fname.field_2._12_4_ = uVar2 + fname.field_2._12_4_;
    if (local_4c == T_STOP) break;
    if (local_4e == 1) {
      if (local_4c == T_STRING) {
        uVar2 = apache::thrift::protocol::TProtocol::readString(tracker.prot_,&this->traceId);
        fname.field_2._12_4_ = uVar2 + fname.field_2._12_4_;
        bVar1 = true;
      }
      else {
        uVar2 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar2 + fname.field_2._12_4_;
      }
    }
    else {
      uVar2 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
      fname.field_2._12_4_ = uVar2 + fname.field_2._12_4_;
    }
    uVar2 = apache::thrift::protocol::TProtocol::readFieldEnd(tracker.prot_);
    fname.field_2._12_4_ = uVar2 + fname.field_2._12_4_;
  }
  uVar2 = apache::thrift::protocol::TProtocol::readStructEnd(tracker.prot_);
  uVar3 = uVar2 + fname.field_2._12_4_;
  fname.field_2._12_4_ = uVar3;
  if (bVar1) {
    std::__cxx11::string::~string((string *)local_48);
    apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
              ((TInputRecursionTracker *)&stack0xffffffffffffffe0);
    return (ulong)uVar3;
  }
  this_00 = (TProtocolException *)__cxa_allocate_exception(0x30);
  apache::thrift::protocol::TProtocolException::TProtocolException(this_00,INVALID_DATA);
  __cxa_throw(this_00,&apache::thrift::protocol::TProtocolException::typeinfo,
              apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t AggregationValidator_validateTrace_args::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_traceId = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->traceId);
          isset_traceId = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_traceId)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}